

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O3

void __thiscall nuraft::buffer_serializer::put_i16(buffer_serializer *this,int16_t val)

{
  size_t sVar1;
  ushort uVar2;
  size_t sVar3;
  byte *pbVar4;
  overflow_error *this_00;
  byte bVar5;
  bool bVar6;
  
  sVar1 = this->pos_;
  sVar3 = buffer::size(this->buf_);
  if (sVar1 + 2 <= sVar3) {
    pbVar4 = buffer::data_begin(this->buf_);
    bVar6 = this->endian_ == LITTLE;
    sVar1 = this->pos_;
    uVar2 = val;
    if (bVar6) {
      uVar2 = (ushort)val >> 8;
    }
    bVar5 = (byte)((ushort)val >> 8);
    if (bVar6) {
      bVar5 = (byte)val;
    }
    pbVar4[sVar1] = bVar5;
    pbVar4[sVar1 + 1] = (byte)uVar2;
    pos(this,this->pos_ + 2);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer_serializer::put_i16(int16_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { put16l(val, ptr); }
    else                    { put16b(val, ptr); }
    pos( pos() + sizeof(val) );
}